

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

void __thiscall cmSourceFile::SetProperty(cmSourceFile *this,string *prop,cmValue value)

{
  size_t __n;
  int iVar1;
  cmListFileBacktrace lfbt;
  cmListFileBacktrace cStack_38;
  cmValue local_28;
  
  __n = prop->_M_string_length;
  local_28.Value = value.Value;
  if ((__n == propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar1 = bcmp((prop->_M_dataplus)._M_p,propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n
                   ), iVar1 == 0)))) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_at_end(&this->IncludeDirectories,
                      (this->IncludeDirectories).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (value.Value == (string *)0x0) {
      return;
    }
    cmMakefile::GetBacktrace((this->Location).Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<cmValue&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->IncludeDirectories,&local_28,&cStack_38);
  }
  else if ((__n == propCOMPILE_OPTIONS_abi_cxx11_._M_string_length) &&
          ((__n == 0 ||
           (iVar1 = bcmp((prop->_M_dataplus)._M_p,propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,
                         __n), iVar1 == 0)))) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_at_end(&this->CompileOptions,
                      (this->CompileOptions).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (value.Value == (string *)0x0) {
      return;
    }
    cmMakefile::GetBacktrace((this->Location).Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<cmValue&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->CompileOptions,&local_28,&cStack_38);
  }
  else {
    if ((__n != propCOMPILE_DEFINITIONS_abi_cxx11_._M_string_length) ||
       ((__n != 0 &&
        (iVar1 = bcmp((prop->_M_dataplus)._M_p,propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p,
                      __n), iVar1 != 0)))) {
      cmPropertyMap::SetProperty(&this->Properties,prop,value);
      return;
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_at_end(&this->CompileDefinitions,
                      (this->CompileDefinitions).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (value.Value == (string *)0x0) {
      return;
    }
    cmMakefile::GetBacktrace((this->Location).Makefile);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<cmValue&,cmListFileBacktrace&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &this->CompileDefinitions,&local_28,&cStack_38);
  }
  if (cStack_38.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cStack_38.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void cmSourceFile::SetProperty(const std::string& prop, cmValue value)
{
  if (prop == propINCLUDE_DIRECTORIES) {
    this->IncludeDirectories.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->IncludeDirectories.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->CompileOptions.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileOptions.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->CompileDefinitions.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileDefinitions.emplace_back(value, lfbt);
    }
  } else {
    this->Properties.SetProperty(prop, value);
  }
}